

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O1

void __thiscall MercuryJson::JSON::exec_stage1(JSON *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  char *pcVar3;
  size_t *psVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  runtime_error *this_00;
  ulong uVar15;
  ulong in_RDX;
  size_t i_1;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t i;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  
  if (this->input_len == 0) {
    bVar26 = true;
    uVar13 = 0;
    uVar17 = 0;
  }
  else {
    pcVar3 = this->input;
    psVar4 = this->indices;
    uVar15 = 1;
    uVar17 = 0;
    auVar27[8] = 0x5c;
    auVar27._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar27[9] = 0x5c;
    auVar27[10] = 0x5c;
    auVar27[0xb] = 0x5c;
    auVar27[0xc] = 0x5c;
    auVar27[0xd] = 0x5c;
    auVar27[0xe] = 0x5c;
    auVar27[0xf] = 0x5c;
    auVar27[0x10] = 0x5c;
    auVar27[0x11] = 0x5c;
    auVar27[0x12] = 0x5c;
    auVar27[0x13] = 0x5c;
    auVar27[0x14] = 0x5c;
    auVar27[0x15] = 0x5c;
    auVar27[0x16] = 0x5c;
    auVar27[0x17] = 0x5c;
    auVar27[0x18] = 0x5c;
    auVar27[0x19] = 0x5c;
    auVar27[0x1a] = 0x5c;
    auVar27[0x1b] = 0x5c;
    auVar27[0x1c] = 0x5c;
    auVar27[0x1d] = 0x5c;
    auVar27[0x1e] = 0x5c;
    auVar27[0x1f] = 0x5c;
    auVar28[8] = 0x22;
    auVar28._0_8_ = 0x2222222222222222;
    auVar28[9] = 0x22;
    auVar28[10] = 0x22;
    auVar28[0xb] = 0x22;
    auVar28[0xc] = 0x22;
    auVar28[0xd] = 0x22;
    auVar28[0xe] = 0x22;
    auVar28[0xf] = 0x22;
    auVar28[0x10] = 0x22;
    auVar28[0x11] = 0x22;
    auVar28[0x12] = 0x22;
    auVar28[0x13] = 0x22;
    auVar28[0x14] = 0x22;
    auVar28[0x15] = 0x22;
    auVar28[0x16] = 0x22;
    auVar28[0x17] = 0x22;
    auVar28[0x18] = 0x22;
    auVar28[0x19] = 0x22;
    auVar28[0x1a] = 0x22;
    auVar28[0x1b] = 0x22;
    auVar28[0x1c] = 0x22;
    auVar28[0x1d] = 0x22;
    auVar28[0x1e] = 0x22;
    auVar28[0x1f] = 0x22;
    auVar5 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29._8_2_ = 0xf7f;
    auVar29._0_8_ = 0xf7f0f7f0f7f0f7f;
    auVar29._10_2_ = 0xf7f;
    auVar29._12_2_ = 0xf7f;
    auVar29._14_2_ = 0xf7f;
    auVar29._16_2_ = 0xf7f;
    auVar29._18_2_ = 0xf7f;
    auVar29._20_2_ = 0xf7f;
    auVar29._22_2_ = 0xf7f;
    auVar29._24_2_ = 0xf7f;
    auVar29._26_2_ = 0xf7f;
    auVar29._28_2_ = 0xf7f;
    auVar29._30_2_ = 0xf7f;
    auVar30._16_16_ = _DAT_00116d60;
    auVar30._0_16_ = _DAT_00116d60;
    auVar31._16_16_ = _DAT_00116d70;
    auVar31._0_16_ = _DAT_00116d70;
    auVar32[8] = 0x18;
    auVar32._0_8_ = 0x1818181818181818;
    auVar32[9] = 0x18;
    auVar32[10] = 0x18;
    auVar32[0xb] = 0x18;
    auVar32[0xc] = 0x18;
    auVar32[0xd] = 0x18;
    auVar32[0xe] = 0x18;
    auVar32[0xf] = 0x18;
    auVar32[0x10] = 0x18;
    auVar32[0x11] = 0x18;
    auVar32[0x12] = 0x18;
    auVar32[0x13] = 0x18;
    auVar32[0x14] = 0x18;
    auVar32[0x15] = 0x18;
    auVar32[0x16] = 0x18;
    auVar32[0x17] = 0x18;
    auVar32[0x18] = 0x18;
    auVar32[0x19] = 0x18;
    auVar32[0x1a] = 0x18;
    auVar32[0x1b] = 0x18;
    auVar32[0x1c] = 0x18;
    auVar32[0x1d] = 0x18;
    auVar32[0x1e] = 0x18;
    auVar32[0x1f] = 0x18;
    auVar33[8] = 7;
    auVar33._0_8_ = 0x707070707070707;
    auVar33[9] = 7;
    auVar33[10] = 7;
    auVar33[0xb] = 7;
    auVar33[0xc] = 7;
    auVar33[0xd] = 7;
    auVar33[0xe] = 7;
    auVar33[0xf] = 7;
    auVar33[0x10] = 7;
    auVar33[0x11] = 7;
    auVar33[0x12] = 7;
    auVar33[0x13] = 7;
    auVar33[0x14] = 7;
    auVar33[0x15] = 7;
    auVar33[0x16] = 7;
    auVar33[0x17] = 7;
    auVar33[0x18] = 7;
    auVar33[0x19] = 7;
    auVar33[0x1a] = 7;
    auVar33[0x1b] = 7;
    auVar33[0x1c] = 7;
    auVar33[0x1d] = 7;
    auVar33[0x1e] = 7;
    auVar33[0x1f] = 7;
    uVar13 = 0;
    uVar21 = 0;
    uVar19 = 0;
    do {
      auVar1 = *(undefined1 (*) [32])(pcVar3 + uVar13);
      auVar2 = *(undefined1 (*) [32])(pcVar3 + uVar13 + 0x20);
      lVar20 = vpcmpeqb_avx512vl(auVar2,auVar27);
      uVar6 = vpcmpeqb_avx512vl(auVar1,auVar27);
      uVar22 = lVar20 << 0x20 | CONCAT44((int)((ulong)pcVar3 >> 0x20),(int)uVar6);
      uVar16 = ~(uVar22 * 2) & uVar22;
      uVar24 = uVar16 & 0xaaaaaaaaaaaaaaaa | uVar21;
      sVar23 = this->num_indices;
      if (uVar17 != 0) {
        in_RDX = uVar13 - 0x40;
        lVar20 = 0;
        uVar18 = uVar17;
        do {
          do {
            lVar12 = 0;
            for (uVar25 = uVar18; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            psVar4[this->num_indices + lVar20] = lVar12 + in_RDX;
            uVar18 = uVar18 - 1 & uVar18;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 8);
          this->num_indices = this->num_indices + 8;
          lVar20 = 0;
        } while (uVar18 != 0);
      }
      uVar18 = uVar16 & 0x5555555555555555 ^ uVar21;
      uVar21 = (ulong)CARRY8(uVar24,uVar22);
      uVar6 = vpcmpeqb_avx512vl(auVar2,auVar28);
      uVar7 = vpcmpeqb_avx512vl(auVar1,auVar28);
      uVar16 = CONCAT44(0x55555555,(int)uVar6) << 0x20 | CONCAT44((int)(in_RDX >> 0x20),(int)uVar7);
      uVar22 = ~((uVar24 + uVar22 ^ uVar22) & 0x5555555555555555 |
                (uVar18 + uVar22 ^ uVar22) & 0xaaaaaaaaaaaaaaaa) & uVar16;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar22;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = auVar5._0_8_;
      auVar9 = (undefined1  [16])0x0;
      for (uVar8 = 0; uVar8 < 0x40; uVar8 = uVar8 + 1) {
        if ((auVar10 & (undefined1  [16])0x1 << uVar8) != (undefined1  [16])0x0) {
          auVar9 = auVar9 ^ auVar11 << uVar8;
        }
      }
      uVar25 = auVar9._0_8_ ^ uVar19;
      uVar19 = (long)uVar25 >> 0x3f;
      this->num_indices = sVar23 + POPCOUNT(uVar17);
      auVar34 = vpsrlw_avx2(auVar2,4);
      auVar34 = vpand_avx2(auVar34,auVar29);
      auVar34 = vpshufb_avx2(auVar30,auVar34);
      auVar2 = vpshufb_avx2(auVar31,auVar2);
      auVar2 = vpand_avx2(auVar2,auVar34);
      auVar34 = vpsrlw_avx2(auVar1,4);
      auVar34 = vpand_avx2(auVar34,auVar29);
      auVar34 = vpshufb_avx2(auVar30,auVar34);
      auVar1 = vpshufb_avx2(auVar31,auVar1);
      auVar1 = vpand_avx2(auVar1,auVar34);
      lVar20 = vptestnmb_avx512vl(auVar2,auVar32);
      uVar6 = vptestnmb_avx512vl(auVar1,auVar32);
      uVar18 = lVar20 << 0x20 | CONCAT44((int)(uVar16 >> 0x20),(int)uVar6);
      lVar20 = vptestnmb_avx512vl(auVar2,auVar33);
      uVar6 = vptestnmb_avx512vl(auVar1,auVar33);
      uVar24 = ~(lVar20 << 0x20 | CONCAT44((int)(uVar17 >> 0x20),(int)uVar6) | uVar25);
      uVar16 = ~(uVar18 | uVar25) | uVar24;
      uVar17 = uVar15 + uVar16 * 2;
      uVar15 = uVar16 >> 0x3f;
      in_RDX = uVar24 | uVar22 | ~uVar25 & uVar17 & uVar18;
      uVar17 = (~uVar22 | uVar25) & in_RDX;
      uVar13 = uVar13 + 0x40;
    } while (uVar13 < this->input_len);
    bVar26 = -1 < (long)uVar25;
  }
  sVar23 = this->num_indices;
  psVar4 = this->indices;
  if (uVar17 != 0) {
    lVar20 = 0;
    uVar15 = uVar17;
    do {
      do {
        lVar12 = 0;
        for (uVar19 = uVar15; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar12 = lVar12 + 1;
        }
        psVar4[this->num_indices + lVar20] = lVar12 + (uVar13 - 0x40);
        uVar15 = uVar15 - 1 & uVar15;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 8);
      this->num_indices = this->num_indices + 8;
      lVar20 = 0;
    } while (uVar15 != 0);
  }
  sVar23 = sVar23 + POPCOUNT(uVar17);
  this->num_indices = sVar23;
  if (sVar23 != 0) {
    if (this->input[psVar4[sVar23 - 1]] == '\0') goto LAB_0010e589;
  }
  sVar14 = strlen(this->input + (uVar13 - 0x40));
  this->num_indices = sVar23 + 1;
  psVar4[sVar23] = sVar14 + (uVar13 - 0x40);
LAB_0010e589:
  if (bVar26) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unclosed quotation marks");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void JSON::exec_stage1() {
        uint64_t prev_escape_mask = 0;
        uint64_t prev_quote_mask = 0;
        uint64_t prev_pseudo_mask = 1;  // initial value set to 1 to allow literals at beginning of input
        uint64_t quote_mask, structural_mask, whitespace_mask;
        uint64_t pseudo_mask = 0;
        size_t offset = 0;
        for (; offset < input_len; offset += 64) {
            Warp warp(input + offset);
            uint64_t escape_mask = extract_escape_mask(warp, &prev_escape_mask);
            uint64_t literal_mask = extract_literal_mask(warp, escape_mask, &prev_quote_mask, &quote_mask);

            // Dump pointers for *previous* iteration.
            construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);

            extract_structural_whitespace_characters(warp, literal_mask, &structural_mask, &whitespace_mask);
            pseudo_mask = extract_pseudo_structural_mask(
                    structural_mask, whitespace_mask, quote_mask, literal_mask, &prev_pseudo_mask);
        }
        // Dump pointers for the final iteration.
        construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);
        if (num_indices == 0 || input[indices[num_indices - 1]] != '\0')  // Ensure '\0' is added to indices.
            indices[num_indices++] = offset - 64 + strlen(input + offset - 64);
        if (prev_quote_mask != 0)
            throw std::runtime_error("unclosed quotation marks");
    }